

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

void __thiscall Image_PfmIO_Test::TestBody(Image_PfmIO_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  Point2i p;
  Point2i p_00;
  Point2i resolution;
  bool bVar1;
  undefined1 uVar2;
  PixelFormat PVar3;
  char *pcVar4;
  int *piVar5;
  AssertionResult gtest_ar_5;
  ColorEncodingHandle *in_stack_000001e8;
  string *in_stack_000001f0;
  Allocator in_stack_000001f8;
  AssertionResult gtest_ar_4;
  int c;
  int x;
  int y;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ImageAndMetadata read;
  AssertionResult gtest_ar_;
  Image image;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  Point2i res;
  int in_stack_fffffffffffff748;
  int in_stack_fffffffffffff74c;
  ImageAndMetadata *in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff758;
  WrapMode in_stack_fffffffffffff75c;
  undefined7 in_stack_fffffffffffff760;
  undefined1 in_stack_fffffffffffff767;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffff768;
  undefined7 in_stack_fffffffffffff770;
  undefined1 in_stack_fffffffffffff777;
  Type in_stack_fffffffffffff77c;
  Image *in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff78c;
  undefined4 in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff794;
  int iVar6;
  char *in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7bc;
  char *in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c8;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffff7cc;
  undefined4 in_stack_fffffffffffff7d0;
  WrapMode in_stack_fffffffffffff7d4;
  WrapMode in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7dc;
  int iVar8;
  int iVar9;
  int in_stack_fffffffffffff7e4;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff7e8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffff820;
  Image *in_stack_fffffffffffff828;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff830;
  undefined7 in_stack_fffffffffffff840;
  undefined1 in_stack_fffffffffffff847;
  string *local_740;
  AssertionResult local_6e0 [3];
  Float local_6b0;
  Float local_69c;
  AssertionResult local_698;
  Type local_684;
  int local_680;
  int local_67c;
  int local_668;
  undefined4 local_664;
  AssertionResult local_660 [2];
  PixelFormat local_640;
  undefined4 local_63c;
  AssertionResult local_638 [2];
  Tuple2<pbrt::Point2,_int> local_618;
  Tuple2<pbrt::Point2,_int> local_610;
  AssertionResult local_608 [2];
  AssertionResult local_5e8 [2];
  allocator<char> local_5c1;
  string local_5c0 [32];
  Image local_5a0;
  string local_388 [48];
  optional<float> local_358;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_350;
  undefined4 local_310;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_30c;
  undefined4 local_2cc;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_2c8;
  undefined4 local_2b8;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_2b4;
  undefined4 local_2ac;
  optional<int> local_2a8;
  optional<float> local_2a0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  allocator<char> local_251;
  string local_250 [32];
  AssertionResult local_230;
  undefined1 local_21c;
  allocator<char> local_21b;
  allocator<char> local_21a;
  allocator<char> local_219;
  string *local_218;
  string local_210 [32];
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [32];
  string *local_1b0;
  undefined8 local_1a8;
  Tuple2<pbrt::Point2,_int> local_190;
  ImageMetadata *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  Image *in_stack_ffffffffffffffc0;
  Tuple2<pbrt::Point2,_int> local_10 [2];
  
  pbrt::Point2<int>::Point2
            ((Point2<int> *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c,
             in_stack_fffffffffffff748);
  GetFloatPixels((Point2i)in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e4);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
            ((polymorphic_allocator<float> *)in_stack_fffffffffffff750);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770),in_stack_fffffffffffff768
             ,(polymorphic_allocator<float> *)
              CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760));
  local_190 = local_10[0];
  local_21c = 1;
  local_218 = local_210;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             (char *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
             (allocator<char> *)in_stack_fffffffffffff780);
  local_218 = (string *)local_1f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             (char *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
             (allocator<char> *)in_stack_fffffffffffff780);
  local_218 = (string *)local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             (char *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
             (allocator<char> *)in_stack_fffffffffffff780);
  local_21c = 0;
  local_1b0 = local_210;
  local_1a8 = 3;
  v._M_array._4_4_ = in_stack_fffffffffffff75c;
  v._M_array._0_4_ = in_stack_fffffffffffff758;
  v._M_len._0_7_ = in_stack_fffffffffffff760;
  v._M_len._7_1_ = in_stack_fffffffffffff767;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff750,v);
  resolution.super_Tuple2<pbrt::Point2,_int>.y._3_1_ = in_stack_fffffffffffff847;
  resolution.super_Tuple2<pbrt::Point2,_int>._0_7_ = in_stack_fffffffffffff840;
  pbrt::Image::Image(in_stack_fffffffffffff828,in_stack_fffffffffffff820,resolution,
                     in_stack_fffffffffffff830);
  local_740 = (string *)&local_1b0;
  do {
    local_740 = local_740 + -0x20;
    std::__cxx11::string::~string(local_740);
  } while (local_740 != local_210);
  std::allocator<char>::~allocator(&local_21b);
  std::allocator<char>::~allocator(&local_21a);
  std::allocator<char>::~allocator(&local_219);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_stack_fffffffffffff750);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             (char *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
             (allocator<char> *)in_stack_fffffffffffff780);
  local_358.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_358.set = false;
  local_358._5_3_ = 0;
  pstd::optional<float>::optional(&local_358);
  local_350 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
              vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_310 = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_350.__align);
  local_30c = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>)
              vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_2cc = 0;
  pstd::optional<pbrt::SquareMatrix<4>_>::optional
            ((optional<pbrt::SquareMatrix<4>_> *)&local_30c.__align);
  local_2c8 = (aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)>)0x0;
  local_2b8 = 0;
  pstd::optional<pbrt::Bounds2<int>_>::optional((optional<pbrt::Bounds2<int>_> *)&local_2c8.__align)
  ;
  local_2ac = 0;
  local_2b4 = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>)0x0;
  pstd::optional<pbrt::Point2<int>_>::optional((optional<pbrt::Point2<int>_> *)&local_2b4.__align);
  local_2a8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  local_2a8.set = false;
  local_2a8._5_3_ = 0;
  pstd::optional<int>::optional(&local_2a8);
  local_2a0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_2a0.set = false;
  local_2a0._5_3_ = 0;
  pstd::optional<float>::optional(&local_2a0);
  local_298 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
               )0x0;
  uStack_290 = 0;
  pstd::optional<const_pbrt::RGBColorSpace_*>::optional
            ((optional<const_pbrt::RGBColorSpace_*> *)&local_298.__align);
  uStack_268 = 0;
  uStack_260 = 0;
  local_288 = 0;
  uStack_280 = 0;
  uStack_278 = 0;
  uStack_270 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0x5c2cca);
  pbrt::Image::Write(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffff750,
             SUB41((uint)in_stack_fffffffffffff74c >> 0x18,0));
  pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)in_stack_fffffffffffff750);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_230);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff780);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
               in_stack_fffffffffffff7c0,
               (char *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
               in_stack_fffffffffffff7b0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c,
               (char *)CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770),
               (int)((ulong)in_stack_fffffffffffff768 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               (Message *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff750);
    std::__cxx11::string::~string(local_388);
    testing::Message::~Message((Message *)0x5c2fd9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c3054);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
             (char *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
             (allocator<char> *)in_stack_fffffffffffff780);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff750);
  pbrt::ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)in_stack_fffffffffffff750,
             (nullptr_t)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
  pbrt::Image::Read(in_stack_000001f0,in_stack_000001f8,in_stack_000001e8);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  pbrt::ImageMetadata::GetColorSpace
            ((ImageMetadata *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
  testing::internal::EqHelper<false>::Compare<pbrt::RGBColorSpace,pbrt::RGBColorSpace>
            ((char *)in_stack_fffffffffffff768,
             (char *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
             (RGBColorSpace *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
             (RGBColorSpace *)in_stack_fffffffffffff750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff780);
    testing::AssertionResult::failure_message((AssertionResult *)0x5c3212);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c,
               (char *)CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770),
               (int)((ulong)in_stack_fffffffffffff768 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               (Message *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff750);
    testing::Message::~Message((Message *)0x5c3275);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c32cd);
  local_610 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution((Image *)&stack0xfffffffffffffeb0);
  local_618 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(&local_5a0);
  iVar9 = local_618.x;
  testing::internal::EqHelper<false>::Compare<pbrt::Point2<int>,pbrt::Point2<int>>
            ((char *)in_stack_fffffffffffff768,
             (char *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
             (Point2<int> *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
             (Point2<int> *)in_stack_fffffffffffff750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_608);
  iVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7dc);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff780);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x5c33b7);
    in_stack_fffffffffffff7d0 = SUB84(pcVar4,0);
    in_stack_fffffffffffff7d4 = (WrapMode)((ulong)pcVar4 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c,
               (char *)CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770),
               (int)((ulong)in_stack_fffffffffffff768 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               (Message *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff750);
    testing::Message::~Message((Message *)0x5c341a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c3472);
  local_63c = 2;
  PVar3 = pbrt::Image::Format(&local_5a0);
  local_640 = PVar3;
  testing::internal::EqHelper<false>::Compare<pbrt::PixelFormat,pbrt::PixelFormat>
            ((char *)in_stack_fffffffffffff768,
             (char *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
             (PixelFormat *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
             (PixelFormat *)in_stack_fffffffffffff750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_638);
  uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff780);
    in_stack_fffffffffffff7c0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x5c353d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c,
               (char *)CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770),
               (int)((ulong)in_stack_fffffffffffff768 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               (Message *)CONCAT44(PVar3,uVar7));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff750);
    testing::Message::~Message((Message *)0x5c359a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c35f2);
  local_664 = 3;
  local_668 = pbrt::Image::NChannels((Image *)0x5c360a);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)in_stack_fffffffffffff768,
             (char *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
             (int *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
             (int *)in_stack_fffffffffffff750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_660);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff780);
    testing::AssertionResult::failure_message((AssertionResult *)0x5c36b1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c,
               (char *)CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770),
               (int)((ulong)in_stack_fffffffffffff768 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               (Message *)CONCAT44(PVar3,uVar7));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff750);
    testing::Message::~Message((Message *)0x5c370e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c3766);
  for (local_67c = 0; iVar6 = local_67c,
      piVar5 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,1), iVar6 < *piVar5;
      local_67c = local_67c + 1) {
    local_680 = 0;
    while (iVar6 = local_680, piVar5 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0),
          iVar6 < *piVar5) {
      for (local_684 = kSuccess; (int)local_684 < 3; local_684 = local_684 + kNonFatalFailure) {
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c,
                   in_stack_fffffffffffff748);
        pbrt::WrapMode2D::WrapMode2D
                  ((WrapMode2D *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                   in_stack_fffffffffffff75c);
        p.super_Tuple2<pbrt::Point2,_int>.y = iVar9;
        p.super_Tuple2<pbrt::Point2,_int>.x = iVar8;
        wrapMode.wrap.values[1] = in_stack_fffffffffffff7d8;
        wrapMode.wrap.values[0] = in_stack_fffffffffffff7d4;
        local_69c = pbrt::Image::GetChannel
                              ((Image *)CONCAT44(PVar3,uVar7),p,
                               (int)((ulong)in_stack_fffffffffffff7c0 >> 0x20),wrapMode);
        in_stack_fffffffffffff780 = &local_5a0;
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c,
                   in_stack_fffffffffffff748);
        in_stack_fffffffffffff77c = local_684;
        pbrt::WrapMode2D::WrapMode2D
                  ((WrapMode2D *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                   in_stack_fffffffffffff75c);
        p_00.super_Tuple2<pbrt::Point2,_int>.y = iVar9;
        p_00.super_Tuple2<pbrt::Point2,_int>.x = iVar8;
        wrapMode_00.wrap.values[1] = in_stack_fffffffffffff7d8;
        wrapMode_00.wrap.values[0] = in_stack_fffffffffffff7d4;
        local_6b0 = pbrt::Image::GetChannel
                              ((Image *)CONCAT44(PVar3,uVar7),p_00,
                               (int)((ulong)in_stack_fffffffffffff7c0 >> 0x20),wrapMode_00);
        testing::internal::EqHelper<false>::Compare<float,float>
                  ((char *)in_stack_fffffffffffff768,
                   (char *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
                   (float *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
                   (float *)in_stack_fffffffffffff750);
        in_stack_fffffffffffff777 = testing::AssertionResult::operator_cast_to_bool(&local_698);
        if (!(bool)in_stack_fffffffffffff777) {
          testing::Message::Message((Message *)in_stack_fffffffffffff780);
          in_stack_fffffffffffff768 =
               (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
               testing::AssertionResult::failure_message((AssertionResult *)0x5c3984);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c,
                     (char *)CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770),
                     (int)((ulong)in_stack_fffffffffffff768 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                     (Message *)CONCAT44(PVar3,uVar7));
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff750);
          testing::Message::~Message((Message *)0x5c39e1);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c3a36);
      }
      local_680 = local_680 + 1;
    }
  }
  remove("test.pfm");
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)in_stack_fffffffffffff768,
             (char *)CONCAT17(in_stack_fffffffffffff767,in_stack_fffffffffffff760),
             (int *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
             (int *)in_stack_fffffffffffff750,
             (type *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
  iVar8 = (int)((ulong)in_stack_fffffffffffff768 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_6e0);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff780);
    testing::AssertionResult::failure_message((AssertionResult *)0x5c3b35);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff780,in_stack_fffffffffffff77c,
               (char *)CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770),iVar8,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffff760));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               (Message *)CONCAT44(PVar3,uVar7));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff750);
    testing::Message::~Message((Message *)0x5c3b92);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c3be7);
  pbrt::ImageAndMetadata::~ImageAndMetadata(in_stack_fffffffffffff750);
  pbrt::Image::~Image(&in_stack_fffffffffffff750->image);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_stack_fffffffffffff750);
  return;
}

Assistant:

TEST(Image, PfmIO) {
    Point2i res(16, 49);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    Image image(rgbPixels, res, {"R", "G", "B"});
    EXPECT_TRUE(image.Write("test.pfm"));
    ImageAndMetadata read = Image::Read("test.pfm");
    EXPECT_EQ(*RGBColorSpace::sRGB, *read.metadata.GetColorSpace());

    EXPECT_EQ(image.Resolution(), read.image.Resolution());
    EXPECT_EQ(PixelFormat::Float, read.image.Format());
    EXPECT_EQ(3, read.image.NChannels());

    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x)
            for (int c = 0; c < 3; ++c)
                EXPECT_EQ(image.GetChannel({x, y}, c), read.image.GetChannel({x, y}, c));

    EXPECT_EQ(0, remove("test.pfm"));
}